

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__int_array
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  undefined8 in_RAX;
  int_array__AttributeData *piVar2;
  StringHash SVar3;
  sint64 sVar4;
  uint64 uVar5;
  xmlChar **ppxVar6;
  bool failed_1;
  bool failed;
  undefined8 uStack_38;
  bool failed_2;
  
  uStack_38 = in_RAX;
  piVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::int_array__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    for (; text = *ppxVar6, text != (ParserChar *)0x0; ppxVar6 = ppxVar6 + 2) {
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar6[1];
      if (SVar3 == 0xf7cb085) {
        sVar4 = GeneratedSaxParser::Utils::toSint64(buffer,&failed_2);
        piVar2->minInclusive = sVar4;
        if (failed_2 == true) {
          SVar3 = 0xf7cb085;
LAB_007488b3:
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xa58e8d9,SVar3,buffer);
          if (bVar1) {
            return false;
          }
        }
      }
      else if (SVar3 == 0x74835) {
        piVar2->name = buffer;
      }
      else if (SVar3 == 0x6a6c54) {
        uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,&failed_1);
        piVar2->count = uVar5;
        if (failed_1 == true) {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xa58e8d9,0x6a6c54,buffer);
          if (bVar1) {
            return false;
          }
        }
        if ((failed_1 & 1U) == 0) {
          *(byte *)&piVar2->present_attributes = (byte)piVar2->present_attributes | 1;
        }
      }
      else if (SVar3 == 0xf045085) {
        sVar4 = GeneratedSaxParser::Utils::toSint64(buffer,&failed);
        piVar2->maxInclusive = sVar4;
        if (failed == true) {
          SVar3 = 0xf045085;
          goto LAB_007488b3;
        }
      }
      else if (SVar3 == 0x6f4) {
        piVar2->id = buffer;
      }
      else {
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0xa58e8d9,text,buffer);
        if (bVar1) {
          return false;
        }
      }
    }
  }
  if (((piVar2->present_attributes & 1) == 0) &&
     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0xa58e8d9,0x6a6c54,(ParserChar *)0x0),
     bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__int_array( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__int_array( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

int_array__AttributeData* attributeData = newData<int_array__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_COUNT:
    {
bool failed;
attributeData->count = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INT_ARRAY,
        HASH_ATTRIBUTE_COUNT,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= int_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_MININCLUSIVE:
    {
bool failed;
attributeData->minInclusive = GeneratedSaxParser::Utils::toSint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INT_ARRAY,
        HASH_ATTRIBUTE_MININCLUSIVE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_MAXINCLUSIVE:
    {
bool failed;
attributeData->maxInclusive = GeneratedSaxParser::Utils::toSint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INT_ARRAY,
        HASH_ATTRIBUTE_MAXINCLUSIVE,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INT_ARRAY, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & int_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INT_ARRAY, HASH_ATTRIBUTE_COUNT, 0 ) )
        return false;
}


    return true;
}